

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArraySamplingTest::prepareCompresedTexture
          (TextureCubeMapArraySamplingTest *this,textureDefinition *texture,formatDefinition *format
          ,resolutionDefinition *resolution,bool mutability)

{
  byte bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  InternalError *pIVar5;
  socklen_t __len;
  sockaddr *__addr;
  GLuint local_94;
  GLubyte *pGStack_90;
  GLuint image_size_1;
  GLubyte *image_data_1;
  GLint mipmap_level_1;
  GLuint local_74;
  GLubyte *pGStack_70;
  GLuint image_size;
  GLubyte *image_data;
  long lStack_60;
  GLint mipmap_level;
  Functions *gl;
  GLuint local_50;
  GLsizei texture_height;
  GLsizei texture_width;
  GLint n_mipmap_levels;
  GLint array_length;
  bool mutability_local;
  resolutionDefinition *resolution_local;
  formatDefinition *format_local;
  textureDefinition *texture_local;
  TextureCubeMapArraySamplingTest *this_local;
  
  texture_width = resolution->m_depth / 6;
  n_mipmap_levels._3_1_ = mutability;
  _array_length = resolution;
  resolution_local = (resolutionDefinition *)format;
  format_local = (formatDefinition *)texture;
  texture_local = (textureDefinition *)this;
  bVar1 = getMipmapLevelCount(resolution->m_width,resolution->m_height);
  __len = (socklen_t)bVar1;
  texture_height = (GLsizei)bVar1;
  local_50 = 0;
  gl._4_4_ = 0;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_60 = CONCAT44(extraout_var,iVar2);
  textureDefinition::bind((textureDefinition *)format_local,0x9009,__addr,__len);
  if ((n_mipmap_levels._3_1_ & 1) == 0) {
    (**(code **)(lStack_60 + 0x1398))
              (0x9009,texture_height,resolution_local->m_width,_array_length->m_width,
               _array_length->m_height,_array_length->m_depth);
    dVar3 = (**(code **)(lStack_60 + 0x800))();
    glu::checkError(dVar3,"texStorage3D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                    ,0xd38);
    local_50 = _array_length->m_width;
    gl._4_4_ = _array_length->m_height;
    for (image_data._4_4_ = 0; (int)image_data._4_4_ < texture_height;
        image_data._4_4_ = image_data._4_4_ + 1) {
      pGStack_70 = (GLubyte *)0x0;
      local_74 = 0;
      getCompressedTexture
                (_array_length->m_width,_array_length->m_height,texture_width,image_data._4_4_,
                 &stack0xffffffffffffff90,&local_74);
      if (pGStack_70 == (GLubyte *)0x0) {
        pIVar5 = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (pIVar5,"Invalid compressed texture","",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                   ,0xd47);
        __cxa_throw(pIVar5,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
      }
      (**(code **)(lStack_60 + 0x2b0))
                (0x9009,image_data._4_4_,0,0,0,local_50,gl._4_4_,_array_length->m_depth,
                 resolution_local->m_width,local_74,pGStack_70);
      dVar3 = (**(code **)(lStack_60 + 0x800))();
      glu::checkError(dVar3,"compressedTexSubImage3D",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                      ,0xd50);
      local_50 = de::max<int>(1,(int)local_50 / 2);
      gl._4_4_ = de::max<int>(1,(int)gl._4_4_ / 2);
    }
  }
  else {
    local_50 = _array_length->m_width;
    gl._4_4_ = _array_length->m_height;
    for (image_data_1._0_4_ = 0; (int)(GLuint)image_data_1 < texture_height;
        image_data_1._0_4_ = (GLuint)image_data_1 + 1) {
      pGStack_90 = (GLubyte *)0x0;
      local_94 = 0;
      getCompressedTexture
                (_array_length->m_width,_array_length->m_height,texture_width,(GLuint)image_data_1,
                 &stack0xffffffffffffff70,&local_94);
      if (pGStack_90 == (GLubyte *)0x0) {
        pIVar5 = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (pIVar5,"Invalid compressed texture","",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                   ,0xd65);
        __cxa_throw(pIVar5,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
      }
      (**(code **)(lStack_60 + 0x290))
                (0x9009,(GLuint)image_data_1,resolution_local->m_width,local_50,gl._4_4_,
                 _array_length->m_depth,0,local_94,pGStack_90);
      dVar3 = (**(code **)(lStack_60 + 0x800))();
      glu::checkError(dVar3,"compressedTexImage3D",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                      ,0xd6c);
      local_50 = de::max<int>(1,(int)local_50 / 2);
      gl._4_4_ = de::max<int>(1,(int)gl._4_4_ / 2);
    }
  }
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::prepareCompresedTexture(const textureDefinition&	texture,
															  const formatDefinition&	 format,
															  const resolutionDefinition& resolution, bool mutability)
{
	static const glw::GLint n_faces = 6;

	const glw::GLint array_length	= resolution.m_depth / n_faces;
	const glw::GLint n_mipmap_levels = getMipmapLevelCount(resolution.m_width, resolution.m_height);
	glw::GLsizei	 texture_width   = 0;
	glw::GLsizei	 texture_height  = 0;

	/* GL functions */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	texture.bind(GL_TEXTURE_CUBE_MAP_ARRAY);

	if (false == mutability)
	{
		gl.texStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, n_mipmap_levels, format.m_source.m_internal_format,
						resolution.m_width, resolution.m_height, resolution.m_depth);

		GLU_EXPECT_NO_ERROR(gl.getError(), "texStorage3D");

		texture_width  = resolution.m_width;
		texture_height = resolution.m_height;

		for (glw::GLint mipmap_level = 0; mipmap_level < n_mipmap_levels; ++mipmap_level)
		{
			const glw::GLubyte* image_data = 0;
			glw::GLuint			image_size = 0;

			getCompressedTexture(resolution.m_width, resolution.m_height, array_length, mipmap_level, image_data,
								 image_size);

			if (0 == image_data)
			{
				throw tcu::InternalError("Invalid compressed texture", "", __FILE__, __LINE__);
			}

			gl.compressedTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, mipmap_level, 0, /* x_offset */
									   0,										   /* y offset */
									   0,										   /* z offset */
									   texture_width, texture_height, resolution.m_depth,
									   format.m_source.m_internal_format, image_size, image_data);

			GLU_EXPECT_NO_ERROR(gl.getError(), "compressedTexSubImage3D");

			texture_width  = de::max(1, texture_width / 2);
			texture_height = de::max(1, texture_height / 2);
		}
	}
	else
	{
		texture_width  = resolution.m_width;
		texture_height = resolution.m_height;

		for (glw::GLint mipmap_level = 0; mipmap_level < n_mipmap_levels; ++mipmap_level)
		{
			const glw::GLubyte* image_data = 0;
			glw::GLuint			image_size = 0;

			getCompressedTexture(resolution.m_width, resolution.m_height, array_length, mipmap_level, image_data,
								 image_size);

			if (0 == image_data)
			{
				throw tcu::InternalError("Invalid compressed texture", "", __FILE__, __LINE__);
			}

			gl.compressedTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, mipmap_level, format.m_source.m_internal_format,
									texture_width, texture_height, resolution.m_depth, 0 /* border */, image_size,
									image_data);

			GLU_EXPECT_NO_ERROR(gl.getError(), "compressedTexImage3D");

			texture_width  = de::max(1, texture_width / 2);
			texture_height = de::max(1, texture_height / 2);
		}
	}
}